

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_score_graph.cpp
# Opt level: O0

void trt_pose::parse::paf_score_graph_out_hw
               (float *score_graph,float *paf_i,float *paf_j,int counts_a,int counts_b,
               float *peaks_a,float *peaks_b,int H,int W,int M,int num_integral_samples)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float dot;
  float pt_paf_j;
  float pt_paf_i;
  int pt_j_int;
  int pt_i_int;
  float pt_j;
  float pt_i;
  float progress;
  int t;
  float increment;
  float integral;
  float uab_j;
  float uab_i;
  float pab_norm;
  float pab_j;
  float pab_i;
  float pb_j;
  float pb_i;
  int b;
  float pa_j;
  float pa_i;
  int a;
  float *peaks_a_local;
  int counts_b_local;
  int counts_a_local;
  float *paf_j_local;
  float *paf_i_local;
  float *score_graph_local;
  
  for (pa_j = 0.0; (int)pa_j < counts_a; pa_j = (float)((int)pa_j + 1)) {
    fVar1 = peaks_a[(int)pa_j << 1];
    fVar2 = peaks_a[(int)pa_j * 2 + 1];
    for (pb_j = 0.0; (int)pb_j < counts_b; pb_j = (float)((int)pb_j + 1)) {
      fVar5 = peaks_b[(int)pb_j << 1] * (float)H - fVar1 * (float)H;
      fVar6 = peaks_b[(int)pb_j * 2 + 1] * (float)W - fVar2 * (float)W;
      fVar7 = sqrtf(fVar5 * fVar5 + fVar6 * fVar6);
      t = 0;
      for (pt_i = 0.0; (int)pt_i < num_integral_samples; pt_i = (float)((int)pt_i + 1)) {
        fVar8 = (float)(int)pt_i / ((float)num_integral_samples - 1.0);
        iVar3 = (int)(fVar8 * fVar5 + fVar1 * (float)H);
        iVar4 = (int)(fVar8 * fVar6 + fVar2 * (float)W);
        if ((((-1 < iVar3) && (iVar3 < H)) && (-1 < iVar4)) && (iVar4 < W)) {
          t = (int)(paf_i[iVar3 * W + iVar4] * (fVar5 / (fVar7 + 1e-05)) +
                    paf_j[iVar3 * W + iVar4] * (fVar6 / (fVar7 + 1e-05)) + (float)t);
        }
      }
      score_graph[(int)pa_j * M + (int)pb_j] = (float)t / (float)num_integral_samples;
    }
  }
  return;
}

Assistant:

void paf_score_graph_out_hw(float *score_graph, // MxM
                            const float *paf_i, // HxW
                            const float *paf_j, // HxW
                            const int counts_a, const int counts_b,
                            const float *peaks_a, // Mx2
                            const float *peaks_b, // Mx2
                            const int H, const int W, const int M,
                            const int num_integral_samples) {
  for (int a = 0; a < counts_a; a++) {
    // compute point A
    float pa_i = peaks_a[a * 2] * H;
    float pa_j = peaks_a[a * 2 + 1] * W;

    for (int b = 0; b < counts_b; b++) {
      // compute point B
      float pb_i = peaks_b[b * 2] * H;
      float pb_j = peaks_b[b * 2 + 1] * W;

      // compute vector A->B
      float pab_i = pb_i - pa_i;
      float pab_j = pb_j - pa_j;

      // compute normalized vector A->B
      float pab_norm = sqrtf(pab_i * pab_i + pab_j * pab_j) + EPS;
      float uab_i = pab_i / pab_norm;
      float uab_j = pab_j / pab_norm;

      float integral = 0.;
      float increment = 1.f / num_integral_samples;

      for (int t = 0; t < num_integral_samples; t++) {
        // compute integral point T
        float progress = (float)t / ((float)num_integral_samples - 1);
        float pt_i = pa_i + progress * pab_i;
        float pt_j = pa_j + progress * pab_j;

        // convert to int
        // note: we do not need to subtract 0.5 when indexing, because
        // round(x - 0.5) = int(x)
        int pt_i_int = (int)pt_i;
        int pt_j_int = (int)pt_j;

        // skip point if out of bounds (will weaken integral)
        if (pt_i_int < 0)
          continue;
        if (pt_i_int >= H)
          continue;
        if (pt_j_int < 0)
          continue;
        if (pt_j_int >= W)
          continue;

        // get vector at integral point from PAF
        float pt_paf_i = paf_i[pt_i_int * W + pt_j_int];
        float pt_paf_j = paf_j[pt_i_int * W + pt_j_int];

        // compute dot product of normalized A->B with PAF vector at integral
        // point
        float dot = pt_paf_i * uab_i + pt_paf_j * uab_j;
        integral += dot;
      }

      integral /= num_integral_samples;
      score_graph[a * M + b] = integral;
    }
  }
}